

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_bam.cc
# Opt level: O2

int parse_bam(int argc,char **argv)

{
  int iVar1;
  htsFile *fp;
  hts_idx_t *idx;
  bam_hdr_t *hdr;
  hts_itr_t *iter;
  bam1_t *b;
  ostream *poVar2;
  runtime_error *prVar3;
  int i;
  long lVar4;
  string seq;
  string qual;
  string region_;
  string bam;
  
  if (argc < 2) {
    usage();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bam,argv[1],(allocator<char> *)&region_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&region_,".",(allocator<char> *)&seq);
    if (argc != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&seq,argv[2],(allocator<char> *)&qual);
      std::__cxx11::string::operator=((string *)&region_,(string *)&seq);
      std::__cxx11::string::~string((string *)&seq);
    }
    if (bam._M_string_length != 0) {
      fp = hts_open(bam._M_dataplus._M_p,"r");
      if (fp == (htsFile *)0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Unable to open BAM/SAM file.");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      idx = sam_index_load(fp,bam._M_dataplus._M_p);
      if (idx == (hts_idx_t *)0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar3,"Unable to open BAM/SAM index. Make sure alignments are indexed");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      hdr = sam_hdr_read(fp);
      iter = sam_itr_querys(idx,hdr,region_._M_dataplus._M_p);
      if ((hdr == (bam_hdr_t *)0x0) || (iter == (hts_itr_t *)0x0)) {
        hts_close(fp);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Unable to iterate to region within BAM.");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      b = bam_init1();
      while( true ) {
        iVar1 = hts_itr_next((fp->fp).bgzf,iter,b,fp);
        if (iVar1 < 0) break;
        poVar2 = std::operator<<((ostream *)&std::cout,"Read Chr: ");
        std::operator<<(poVar2,hdr->target_name[(b->core).tid]);
        poVar2 = std::operator<<((ostream *)&std::cout,"\tPos: ");
        std::ostream::operator<<(poVar2,(b->core).pos);
        seq._M_dataplus._M_p = (pointer)&seq.field_2;
        seq._M_string_length = 0;
        qual._M_dataplus._M_p = (pointer)&qual.field_2;
        qual._M_string_length = 0;
        seq.field_2._M_local_buf[0] = '\0';
        qual.field_2._M_local_buf[0] = '\0';
        iVar1 = (b->core).l_qseq;
        for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
          std::__cxx11::string::push_back((char)&seq);
          std::__cxx11::string::push_back((char)&qual);
          iVar1 = (b->core).l_qseq;
        }
        poVar2 = std::operator<<((ostream *)&std::cout,"\tSeq: ");
        poVar2 = std::operator<<(poVar2,(string *)&seq);
        poVar2 = std::operator<<(poVar2,"\tQual: ");
        std::operator<<(poVar2,(string *)&qual);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::__cxx11::string::~string((string *)&qual);
        std::__cxx11::string::~string((string *)&seq);
      }
      hts_itr_destroy(iter);
      hts_idx_destroy(idx);
      bam_destroy1(b);
      bam_hdr_destroy(hdr);
      hts_close(fp);
    }
    std::__cxx11::string::~string((string *)&region_);
    std::__cxx11::string::~string((string *)&bam);
  }
  return 0;
}

Assistant:

int parse_bam(int argc, char* argv[]) {
    if(argc < 2) {
        return usage();
    }
    string bam = string(argv[1]);
    string region_ = ".";
    if(argc > 2) {
        region_ = string(argv[2]);
    }
    if(!bam.empty()) {
        //open BAM for reading
        samFile *in = sam_open(bam.c_str(), "r");
        if(in == NULL) {
            throw runtime_error("Unable to open BAM/SAM file.");
        }
        //Load the index
        hts_idx_t *idx = sam_index_load(in, bam.c_str());
        if(idx == NULL) {
            throw runtime_error("Unable to open BAM/SAM index."
                                " Make sure alignments are indexed");
        }
        //Get the header
        bam_hdr_t *header = sam_hdr_read(in);
        //Initialize iterator
        hts_itr_t *iter = NULL;
        //Move the iterator to the region we are interested in
        iter  = sam_itr_querys(idx, header, region_.c_str());
        if(header == NULL || iter == NULL) {
            sam_close(in);
            throw runtime_error("Unable to iterate to region within BAM.");
        }
        //Initiate the alignment record
        bam1_t *aln = bam_init1();
        while(sam_itr_next(in, iter, aln) >= 0) {
            cout << "Read Chr: " << header->target_name[aln->core.tid];
            cout << "\tPos: " << aln->core.pos;
            string seq, qual;
            uint8_t *quali = bam_get_qual(aln);
            uint8_t *seqi = bam_get_seq(aln);
            for (int i = 0; i < aln->core.l_qseq; i++) {
                seq += seq_nt16_str[bam_seqi(seqi, i)];
                qual += 33 + quali[i];
            }
            cout << "\tSeq: " << seq << "\tQual: " << qual;
            cout << endl;
        }
        hts_itr_destroy(iter);
        hts_idx_destroy(idx);
        bam_destroy1(aln);
        bam_hdr_destroy(header);
        sam_close(in);
    }
    return 0;
}